

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offset.cpp
# Opt level: O2

pair<double,_double> runBenchmark(void)

{
  pair<double,_double> pVar1;
  SmallOffset *local_40;
  SmallOffset *soa;
  LargeOffset *loa;
  rep local_28;
  
  local_40 = (SmallOffset *)operator_new__(1290000000);
  soa = (SmallOffset *)operator_new__(1290000000);
  loa = (LargeOffset *)
        benchmark<void(&)(SmallOffset*,int),SmallOffset*&,int_const&>
                  (benchmarkOffset<SmallOffset>,&local_40,&LENGTH);
  local_28 = (rep)benchmark<void(&)(LargeOffset*,int),LargeOffset*&,int_const&>
                            (benchmarkOffset<LargeOffset>,(LargeOffset **)&soa,&LENGTH);
  if (local_40 != (SmallOffset *)0x0) {
    operator_delete__(local_40);
  }
  if (soa != (SmallOffset *)0x0) {
    operator_delete__(soa);
  }
  pVar1.second = local_28;
  pVar1.first = (double)loa;
  return pVar1;
}

Assistant:

std::pair<double, double> runBenchmark() {
  SmallOffset* soa = new SmallOffset[LENGTH];
  LargeOffset* loa = new LargeOffset[LENGTH];
  const double d1 = benchmark(benchmarkOffset<SmallOffset>, soa, LENGTH).count();
  const double d2 = benchmark(benchmarkOffset<LargeOffset>, loa, LENGTH).count();
  delete[] soa;
  delete[] loa;
  return {d1, d2};
}